

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef sload(jit_State *J,int32_t slot)

{
  short sVar1;
  long lVar2;
  int in_ESI;
  long in_RDI;
  TRef ref;
  IRType t;
  undefined4 local_34;
  undefined2 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  lVar2 = *(long *)(*(long *)(in_RDI + 0x68) + 0x10) + (long)in_ESI * 8;
  if (*(uint *)(lVar2 + 4) < 0xfffeffff) {
    local_4 = 0xe;
  }
  else if (*(int *)(lVar2 + 4) >> 0xf == -2) {
    local_4 = 3;
  }
  else {
    local_4 = *(uint *)(lVar2 + 4) ^ 0xffffffff;
  }
  sVar1 = (short)*(undefined4 *)(in_RDI + 0x98) + (short)in_ESI;
  *(ushort *)(in_RDI + 0xa4) = (ushort)local_4 | 0x4680;
  *(short *)(in_RDI + 0xa0) = sVar1;
  *(undefined2 *)(in_RDI + 0xa2) = 4;
  local_34 = lj_ir_emit((jit_State *)
                        (CONCAT26((ushort)local_4,
                                  CONCAT24(sVar1,CONCAT22(4,in_stack_ffffffffffffffe0))) |
                        0x4680000000000000));
  if (local_4 < 3) {
    local_34 = local_4 * 0xffffff + 0x7fff;
  }
  *(TRef *)(*(long *)(in_RDI + 0x88) + (long)in_ESI * 4) = local_34;
  return local_34;
}

Assistant:

static TRef sload(jit_State *J, int32_t slot)
{
  IRType t = itype2irt(&J->L->base[slot]);
  TRef ref = emitir_raw(IRTG(IR_SLOAD, t), (int32_t)J->baseslot+slot,
			IRSLOAD_TYPECHECK);
  if (irtype_ispri(t)) ref = TREF_PRI(t);  /* Canonicalize primitive refs. */
  J->base[slot] = ref;
  return ref;
}